

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

int __thiscall
TPZMatrix<Fad<double>_>::Subst_Forward(TPZMatrix<Fad<double>_> *this,TPZFMatrix<Fad<double>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> local_d0;
  Fad<double> sum;
  undefined1 local_a0 [16];
  Fad<double> pivot;
  Fad<double> local_70;
  Fad<double> local_50;
  
  lVar5 = (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])();
  iVar2 = 0;
  if ((lVar5 == CONCAT44(extraout_var,iVar1)) && ((this->super_TPZBaseMatrix).fDecomposed == '\x03')
     ) {
    lVar5 = 0;
    while( true ) {
      iVar1 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0xc])(this);
      if (CONCAT44(extraout_var_00,iVar1) <= lVar5) break;
      (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                (&pivot,this,lVar5,lVar5);
      for (lVar4 = 0; lVar4 < (B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol;
          lVar4 = lVar4 + 1) {
        sum.val_ = 0.0;
        sum.dx_.num_elts = 0;
        sum.dx_.ptr_to_data = (double *)0x0;
        sum.defaultVal = 0.0;
        for (lVar3 = 0; lVar5 != lVar3; lVar3 = lVar3 + 1) {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_50,this,lVar5,lVar3);
          (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x24])(&local_70,B,lVar3,lVar4);
          local_d0.fadexpr_.left_ = &local_50;
          local_d0.fadexpr_.right_ = &local_70;
          Fad<double>::operator+=(&sum,&local_d0);
          Fad<double>::~Fad(&local_70);
          Fad<double>::~Fad(&local_50);
        }
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(&local_70,B,lVar5,lVar4);
        local_a0._8_8_ = &sum;
        local_d0.fadexpr_.left_ = (Fad<double> *)local_a0;
        local_d0.fadexpr_.right_ = &pivot;
        local_a0._0_8_ = &local_70;
        Fad<double>::Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,Fad<double>>>,Fad<double>>>
                  (&local_50,
                   (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                    *)&local_d0);
        (*(B->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x23])(B,lVar5,lVar4,&local_50);
        Fad<double>::~Fad(&local_50);
        Fad<double>::~Fad(&local_70);
        Fad<double>::~Fad(&sum);
      }
      Fad<double>::~Fad(&pivot);
      lVar5 = lVar5 + 1;
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int TPZMatrix<TVar>::Subst_Forward( TPZFMatrix<TVar> *B ) const {
	if ( (B->Rows() != Dim()) || !fDecomposed || fDecomposed != ECholesky)
		return( 0 );
	for ( int64_t r = 0; r < Dim(); r++ ) {
		TVar pivot = GetVal( r, r );
		for ( int64_t c = 0; c < B->Cols();  c++ ) {
			// Faz sum = SOMA( A[r,i] * B[i,c] ); i = 0, ..., r-1.
			//
			TVar sum = 0.0;
			for ( int64_t i = 0; i < r; i++ ) sum += GetVal(r, i) * B->GetVal(i, c);
			
			// Faz B[r,c] = (B[r,c] - sum) / A[r,r].
			//
			B->PutVal( r, c, (B->GetVal(r, c) - sum) / pivot );
		}
	}
	return( 1 );
}